

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

double nonius::detail::
       standard_deviation<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  difference_type dVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *__lhs;
  double variance;
  double m;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffa8;
  anon_class_8_1_54a3980d in_stack_ffffffffffffffb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffd0;
  
  __last._M_current =
       (double *)
       mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __lhs = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
          std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,nonius::detail::standard_deviation<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)::_lambda(double,double)_1_>
                    (in_RSI,__last,(double)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  dVar1 = __gnu_cxx::operator-(__lhs,in_stack_ffffffffffffffa8);
  return SQRT((double)__lhs / (double)dVar1);
}

Assistant:

double standard_deviation(Iterator first, Iterator last) {
            auto m = mean(first, last);
            double variance = std::accumulate(first, last, 0., [m](double a, double b) {
                        double diff = b - m;
                        return a + diff*diff;
                    }) / (last - first);
            return std::sqrt(variance);
        }